

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

void inner_loop<false,false>
               (cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float cost,
               uint32_t *prediction,float *score,float *partial_prediction,bool query_this_label,
               bool *query_needed)

{
  uint in_ECX;
  long in_RDX;
  example *in_R8;
  float *in_R9;
  undefined4 in_XMM0_Da;
  undefined3 in_stack_ffffffffffffffcc;
  float x;
  
  x = (float)(CONCAT13(prediction._0_1_,in_stack_ffffffffffffffcc) & 0x1ffffff);
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT44(in_ECX,in_XMM0_Da),in_R8,(size_t)in_R9);
  *(byte *)CONCAT44(i,cost) = (byte)((uint)x >> 0x18) & 1;
  *score = *(float *)(in_RDX + 0x68a8);
  if ((*(float *)(in_RDX + 0x68a8) < *in_R9) ||
     (((*(float *)(in_RDX + 0x68a8) == *in_R9 && (!NAN(*(float *)(in_RDX + 0x68a8)) && !NAN(*in_R9))
       ) && (in_ECX < *(uint *)&(in_R8->super_example_predict).indices._begin)))) {
    *in_R9 = *(float *)(in_RDX + 0x68a8);
    *(uint *)&(in_R8->super_example_predict).indices._begin = in_ECX;
  }
  add_passthrough_feature_magic
            ((example *)CONCAT44(in_ECX,in_XMM0_Da),(uint64_t)in_R8,(uint64_t)in_R9,x);
  return;
}

Assistant:

inline void inner_loop(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float cost, uint32_t& prediction,
    float& score, float& partial_prediction, bool query_this_label, bool& query_needed)
{
  base.predict(ec, i - 1);
  // cerr << "base.predict ==> partial_prediction=" << ec.partial_prediction << endl;
  if (is_learn)
  {
    vw& all = *cs_a.all;
    ec.l.simple.weight = 1.;
    ec.weight = 1.;
    if (is_simulation)
    {
      // In simulation mode
      if (query_this_label)
      {
        ec.l.simple.label = cost;
        all.sd->queries += 1;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }
    else
    {
      // In reduction mode.
      // If the cost of this label was previously queried, then it should be available for learning now.
      // If the cost of this label was not queried, then skip it.
      if (query_needed)
      {
        ec.l.simple.label = cost;
        if ((cost < cs_a.cost_min) || (cost > cs_a.cost_max))
          cerr << "warning: cost " << cost << " outside of cost range [" << cs_a.cost_min << ", " << cs_a.cost_max
               << "]!" << endl;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }

    if (ec.l.simple.label != FLT_MAX)
      base.learn(ec, i - 1);
  }
  else if (!is_simulation)
    // Prediction in reduction mode could be used by upper layer to ask whether this label needs to be queried.
    // So we return that.
    query_needed = query_this_label;

  partial_prediction = ec.partial_prediction;
  if (ec.partial_prediction < score || (ec.partial_prediction == score && i < prediction))
  {
    score = ec.partial_prediction;
    prediction = i;
  }
  add_passthrough_feature(ec, i, ec.partial_prediction);
}